

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__sampler2D____gl_sampler2D
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  void **validationDataPtr_local;
  void **attributeDataPtr_local;
  ParserAttributes *attributes_local;
  ColladaParserAutoGen14Private *this_local;
  
  return true;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__sampler2D____gl_sampler2D( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__sampler2D____gl_sampler2D( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

    return true;
}